

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

wl_surface * glfwGetWaylandWindow(GLFWwindow *handle)

{
  long in_RDI;
  _GLFWwindow *window;
  wl_surface *local_8;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_8 = (wl_surface *)0x0;
  }
  else if (_glfw.platform.platformID == 0x60003) {
    local_8 = *(wl_surface **)(in_RDI + 0x388);
  }
  else {
    _glfwInputError(0x1000e,"Wayland: Platform not initialized");
    local_8 = (wl_surface *)0x0;
  }
  return local_8;
}

Assistant:

wl_surface* glfwGetWaylandWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (_glfw.platform.platformID != GLFW_PLATFORM_WAYLAND)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE,
                        "Wayland: Platform not initialized");
        return NULL;
    }

    return window->wl.surface;
}